

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

bool __thiscall Clasp::Solver::Dirty::add(Dirty *this,Literal p,WatchList *wl,ClauseHead *c)

{
  bool bVar1;
  size_type sVar2;
  pointer pGVar3;
  Dirty *in_RCX;
  left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *in_RDX;
  left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *in_RDI;
  uintp o;
  left_type *in_stack_ffffffffffffffb8;
  reverse_iterator<Clasp::GenericWatch_*> *in_stack_ffffffffffffffc0;
  left_right_rep<Clasp::Literal,_unsigned_int> *this_00;
  uintp in_stack_ffffffffffffffd0;
  left_right_rep<Clasp::Literal,_unsigned_int> *list;
  bool local_1;
  
  sVar2 = bk_lib::detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::left_size(in_RDX)
  ;
  if (sVar2 < 5) {
    local_1 = false;
  }
  else {
    sVar2 = bk_lib::detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::right_size
                      (in_RDX);
    if (sVar2 == 0) {
      this_00 = (left_right_rep<Clasp::Literal,_unsigned_int> *)0x0;
    }
    else {
      bk_lib::detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::right_begin(in_RDI);
      pGVar3 = std::reverse_iterator<Clasp::GenericWatch_*>::operator->(in_stack_ffffffffffffffc0);
      this_00 = (left_right_rep<Clasp::Literal,_unsigned_int> *)pGVar3->con;
    }
    list = this_00;
    bk_lib::detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::left_begin
              ((left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *)0x1f3d9c);
    bVar1 = add<Clasp::ClauseHead>
                      (in_RCX,(ClauseHead **)list,in_stack_ffffffffffffffd0,(Constraint *)in_RDI);
    if (bVar1) {
      bk_lib::detail::left_right_rep<Clasp::Literal,_unsigned_int>::push_left
                (this_00,in_stack_ffffffffffffffb8);
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool add(Literal p, WatchList& wl, ClauseHead* c) {
		if (wl.left_size() <= min_size) { return false; }
		uintp o = wl.right_size() > 0 ? reinterpret_cast<uintp>(wl.right_begin()->con) : 0;
		if (add(wl.left_begin()->head, o, c)) { dirty.push_left(p); }
		return true;
	}